

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall
kws::Parser::IsBetweenQuote(Parser *this,size_t pos,bool withComments,string *buffer)

{
  bool bVar1;
  string *in_RCX;
  bool local_a9;
  string *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff97;
  size_t in_stack_ffffffffffffff98;
  Parser *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffb0;
  string local_48 [7];
  undefined1 in_stack_ffffffffffffffbf;
  size_t in_stack_ffffffffffffffc0;
  Parser *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::string(local_48,in_RCX);
  bVar1 = IsBetweenSingleQuote
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (bool)in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0);
  local_a9 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff88,in_RCX);
    local_a9 = IsBetweenDoubleQuote
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                          (bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  std::__cxx11::string::~string(local_48);
  return local_a9;
}

Assistant:

bool Parser::IsBetweenQuote(size_t pos,bool withComments,std::string buffer) const
{
  return ( this->IsBetweenSingleQuote(pos,withComments,buffer) ||
    this->IsBetweenDoubleQuote(pos,withComments,buffer) );
}